

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O1

void __thiscall QTranslatorPrivate::clear(QTranslatorPrivate *this)

{
  QObject *translator;
  char *__addr;
  pointer puVar1;
  pointer puVar2;
  QTranslator *pQVar3;
  QArrayData *pQVar4;
  QCoreApplication *receiver;
  bool bVar5;
  QEvent *this_00;
  pointer *__ptr;
  pointer puVar6;
  
  translator = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  __addr = this->unmapPointer;
  if ((__addr != (char *)0x0) && (this->unmapLength != 0)) {
    if ((this->field_0x78 & 1) == 0) {
      if ((this->resource)._M_t.super___uniq_ptr_impl<QResource,_std::default_delete<QResource>_>.
          _M_t.super__Tuple_impl<0UL,_QResource_*,_std::default_delete<QResource>_>.
          super__Head_base<0UL,_QResource_*,_false>._M_head_impl == (QResource *)0x0) {
        operator_delete__(__addr);
      }
    }
    else {
      this->field_0x78 = this->field_0x78 & 0xfe;
      munmap(__addr,this->unmapLength);
    }
  }
  std::__uniq_ptr_impl<QResource,_std::default_delete<QResource>_>::reset
            ((__uniq_ptr_impl<QResource,_std::default_delete<QResource>_> *)&this->resource,
             (pointer)0x0);
  this->unmapPointer = (char *)0x0;
  this->unmapLength = 0;
  this->messageLength = 0;
  this->offsetLength = 0;
  this->contextLength = 0;
  this->numerusRulesLength = 0;
  this->contextArray = (uchar *)0x0;
  this->numerusRulesArray = (uchar *)0x0;
  this->messageArray = (uchar *)0x0;
  this->offsetArray = (uchar *)0x0;
  puVar1 = (this->subTranslators).
           super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->subTranslators).
           super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar1;
  if (puVar2 != puVar1) {
    do {
      pQVar3 = (puVar6->_M_t).super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>.
               _M_t.super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
               super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl;
      if (pQVar3 != (QTranslator *)0x0) {
        (**(code **)((long)(pQVar3->super_QObject)._vptr_QObject + 0x20))();
      }
      (puVar6->_M_t).super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>._M_t.
      super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
      super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl = (QTranslator *)0x0;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
    (this->subTranslators).
    super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  if ((this->language).d.ptr != (char16_t *)0x0) {
    pQVar4 = &((this->language).d.d)->super_QArrayData;
    (this->language).d.d = (Data *)0x0;
    (this->language).d.ptr = (char16_t *)0x0;
    (this->language).d.size = 0;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  if ((this->filePath).d.ptr != (char16_t *)0x0) {
    pQVar4 = &((this->filePath).d.d)->super_QArrayData;
    (this->filePath).d.d = (Data *)0x0;
    (this->filePath).d.ptr = (char16_t *)0x0;
    (this->filePath).d.size = 0;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  bVar5 = QCoreApplicationPrivate::isTranslatorInstalled((QTranslator *)translator);
  receiver = QCoreApplication::self;
  if (!bVar5) {
    return;
  }
  this_00 = (QEvent *)operator_new(0x10);
  QEvent::QEvent(this_00,LanguageChange);
  QCoreApplication::postEvent(&receiver->super_QObject,this_00,0);
  return;
}

Assistant:

void QTranslatorPrivate::clear()
{
    Q_Q(QTranslator);
    if (unmapPointer && unmapLength) {
#if defined(QT_USE_MMAP)
        if (used_mmap) {
            used_mmap = false;
            munmap(unmapPointer, unmapLength);
        } else
#endif
        if (!resource)
            delete [] unmapPointer;
    }

    resource = nullptr;
    unmapPointer = nullptr;
    unmapLength = 0;
    messageArray = nullptr;
    contextArray = nullptr;
    offsetArray = nullptr;
    numerusRulesArray = nullptr;
    messageLength = 0;
    contextLength = 0;
    offsetLength = 0;
    numerusRulesLength = 0;

    subTranslators.clear();

    language.clear();
    filePath.clear();

    if (QCoreApplicationPrivate::isTranslatorInstalled(q))
        QCoreApplication::postEvent(QCoreApplication::instance(),
                                    new QEvent(QEvent::LanguageChange));
}